

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O1

int uv_pipe_open(uv_pipe_t *handle,uv_file fd)

{
  int iVar1;
  
  iVar1 = uv__nonblock_ioctl(fd,1);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv__stream_open((uv_stream_t *)handle,fd,0x60);
  return iVar1;
}

Assistant:

int uv_pipe_open(uv_pipe_t* handle, uv_file fd) {
  int err;

  err = uv__nonblock(fd, 1);
  if (err)
    return err;

#if defined(__APPLE__)
  err = uv__stream_try_select((uv_stream_t*) handle, &fd);
  if (err)
    return err;
#endif /* defined(__APPLE__) */

  return uv__stream_open((uv_stream_t*)handle,
                         fd,
                         UV_STREAM_READABLE | UV_STREAM_WRITABLE);
}